

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_fop_QQQ(DisasContext_conflict8 *dc,int rd,int rs1,int rs2,
                _func_void_TCGContext_ptr_TCGv_ptr_conflict *gen)

{
  TCGContext_conflict8 *pTVar1;
  TCGv_i32 ret;
  uint arg2;
  TCGTemp *local_30;
  
  pTVar1 = dc->uc->tcg_ctx;
  gen_op_load_fpr_QT0(pTVar1,(rs1 & 1U) << 5 | rs1 & 0x1cU);
  gen_op_load_fpr_QT1(pTVar1,rs2 & 0x1cU | (rs2 & 1U) << 5);
  (*gen)(pTVar1,pTVar1->cpu_env);
  local_30 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
  tcg_gen_callN_sparc64
            (pTVar1,helper_check_ieee_exceptions_sparc64,(TCGTemp *)(pTVar1->cpu_fsr + (long)pTVar1)
             ,1,&local_30);
  gen_op_store_QT0_fpr(pTVar1,rd & 0x1cU | (rd & 1U) << 5);
  arg2 = 2 - ((rd & 1U) == 0);
  if ((dc->fprs_dirty & arg2) == 0) {
    pTVar1 = dc->uc->tcg_ctx;
    dc->fprs_dirty = dc->fprs_dirty | arg2;
    ret = pTVar1->cpu_fprs;
    tcg_gen_ori_i32_sparc64(pTVar1,ret,ret,arg2);
  }
  return;
}

Assistant:

static inline void gen_fop_QQQ(DisasContext *dc, int rd, int rs1, int rs2,
                               void (*gen)(TCGContext *, TCGv_ptr))
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    gen_op_load_fpr_QT0(tcg_ctx, QFPREG(rs1));
    gen_op_load_fpr_QT1(tcg_ctx, QFPREG(rs2));

    gen(tcg_ctx, tcg_ctx->cpu_env);
    gen_helper_check_ieee_exceptions(tcg_ctx, tcg_ctx->cpu_fsr, tcg_ctx->cpu_env);

    gen_op_store_QT0_fpr(tcg_ctx, QFPREG(rd));
    gen_update_fprs_dirty(dc, QFPREG(rd));
}